

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::B3DImporter::CanRead(B3DImporter *this,string *pFile,IOSystem *param_2,bool param_3)

{
  long lVar1;
  char *pcVar2;
  bool local_99;
  bool local_81;
  string local_58 [8];
  string ext;
  size_t pos;
  bool param_3_local;
  IOSystem *param_2_local;
  string *pFile_local;
  B3DImporter *this_local;
  
  ext.field_2._8_8_ = std::__cxx11::string::find_last_of((char)pFile,0x2e);
  if (ext.field_2._8_8_ == -1) {
    return false;
  }
  std::__cxx11::string::substr((ulong)local_58,(ulong)pFile);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 3) {
    this_local._7_1_ = false;
    goto LAB_0063fce0;
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
  if (*pcVar2 == 'b') {
LAB_0063fc29:
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
    local_81 = false;
    if (*pcVar2 == '3') {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
      local_99 = true;
      if (*pcVar2 != 'd') {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        local_99 = *pcVar2 == 'D';
      }
      local_81 = local_99;
    }
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
    local_81 = false;
    if (*pcVar2 == 'B') goto LAB_0063fc29;
  }
  this_local._7_1_ = local_81;
LAB_0063fce0:
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool B3DImporter::CanRead( const std::string& pFile, IOSystem* /*pIOHandler*/, bool /*checkSig*/) const{

    size_t pos=pFile.find_last_of( '.' );
    if( pos==string::npos ) {
        return false;
    }

    string ext=pFile.substr( pos+1 );
    if( ext.size()!=3 ) {
        return false;
    }

    return (ext[0]=='b' || ext[0]=='B') && (ext[1]=='3') && (ext[2]=='d' || ext[2]=='D');
}